

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

Matrix44<float> *
Imath_2_5::addOffset<float>
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *inMat,Vec3<float> *tOffset,
          Vec3<float> *rOffset,Vec3<float> *sOffset,Matrix44<float> *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Matrix44<float> S;
  Matrix44<float> O;
  Vec3<float> local_140;
  Matrix44<float> local_130;
  Matrix44<float> local_f0;
  Matrix44<float> local_b0;
  Matrix44<float> local_70;
  
  local_70.x[1][3] = 0.0;
  local_70.x[2][0] = 0.0;
  local_70.x[3][1] = 0.0;
  local_70.x[3][2] = 0.0;
  local_70.x[2][3] = 0.0;
  local_70.x[3][0] = 0.0;
  local_70.x[0][1] = 0.0;
  local_70.x[0][2] = 0.0;
  local_70.x[0][3] = 0.0;
  local_70.x[1][0] = 0.0;
  local_70.x[0][0] = 1.0;
  local_70.x[1][1] = 1.0;
  local_70.x[1][2] = 0.0;
  local_70.x[2][1] = 0.0;
  local_70.x[2][2] = 1.0;
  local_70.x[3][3] = 1.0;
  uVar1 = rOffset->x;
  uVar3 = rOffset->y;
  local_140.x = (float)uVar1 * 0.017453292;
  local_140.y = (float)uVar3 * 0.017453292;
  local_140.z = rOffset->z * 0.017453292;
  Matrix44<float>::rotate<float>(&local_70,&local_140);
  uVar2 = tOffset->x;
  uVar4 = tOffset->y;
  local_70.x[3][2] = tOffset->z;
  local_b0.x[1][3] = 0.0;
  local_b0.x[2][0] = 0.0;
  local_b0.x[2][3] = 0.0;
  local_b0.x[3][0] = 0.0;
  local_b0.x[0][1] = 0.0;
  local_b0.x[0][2] = 0.0;
  local_b0.x[0][3] = 0.0;
  local_b0.x[1][0] = 0.0;
  local_b0.x[3][1] = 0.0;
  local_b0.x[3][2] = 0.0;
  local_b0.x[0][0] = 1.0;
  local_b0.x[1][1] = 1.0;
  local_b0.x[1][2] = 0.0;
  local_b0.x[2][1] = 0.0;
  local_b0.x[2][2] = 1.0;
  local_b0.x[3][3] = 1.0;
  local_70.x[3][0] = (float)uVar2;
  local_70.x[3][1] = (float)uVar4;
  Matrix44<float>::scale<float>(&local_b0,sOffset);
  Matrix44<float>::operator*(&local_130,&local_b0,&local_70);
  Matrix44<float>::operator*(&local_f0,&local_130,inMat);
  Matrix44<float>::operator*(__return_storage_ptr__,&local_f0,ref);
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T>
addOffset( const Matrix44<T>& inMat,
           const Vec3<T>&     tOffset,
           const Vec3<T>&     rOffset,
           const Vec3<T>&     sOffset,
           const Matrix44<T>& ref)
{
    Matrix44<T> O;

    Vec3<T> _rOffset(rOffset);
    _rOffset *= M_PI / 180.0;
    O.rotate (_rOffset);

    O[3][0] = tOffset[0];
    O[3][1] = tOffset[1];
    O[3][2] = tOffset[2];

    Matrix44<T> S;
    S.scale (sOffset);

    Matrix44<T> X = S * O * inMat * ref;

    return X;
}